

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

_ElementType __thiscall
Lib::
FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::BackwardDemodulation::ResultFn,_Inferences::BwSimplificationRecord>,_Inferences::BackwardDemodulation::RemovedIsNonzeroFn,_false>
::next(FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::BackwardDemodulation::ResultFn,_Inferences::BwSimplificationRecord>,_Inferences::BackwardDemodulation::RemovedIsNonzeroFn,_false>
       *this)

{
  BwSimplificationRecord *t;
  long in_RDI;
  Option<Inferences::BwSimplificationRecord> *this_00;
  BwSimplificationRecord BVar1;
  _ElementType _Var2;
  FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::BackwardDemodulation::ResultFn,_Inferences::BwSimplificationRecord>,_Inferences::BackwardDemodulation::RemovedIsNonzeroFn,_false>
  *in_stack_00000008;
  _ElementType out;
  Option<Inferences::BwSimplificationRecord> *in_stack_ffffffffffffff98;
  
  hasNext(in_stack_00000008);
  this_00 = (Option<Inferences::BwSimplificationRecord> *)(in_RDI + 0x58);
  t = OptionBase<Inferences::BwSimplificationRecord>::unwrap
                ((OptionBase<Inferences::BwSimplificationRecord> *)0x76b1cf);
  BVar1 = move_if_value<Inferences::BwSimplificationRecord,_true>(t);
  Option<Inferences::BwSimplificationRecord>::Option
            ((Option<Inferences::BwSimplificationRecord> *)0x76b201);
  Option<Inferences::BwSimplificationRecord>::operator=(this_00,in_stack_ffffffffffffff98);
  Option<Inferences::BwSimplificationRecord>::~Option
            ((Option<Inferences::BwSimplificationRecord> *)0x76b21c);
  _Var2.toRemove = BVar1.toRemove;
  _Var2.replacement = BVar1.replacement;
  return _Var2;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext());
    ASS(_next.isSome());
    OWN_ELEMENT_TYPE out = move_if_value<OWN_ELEMENT_TYPE>(_next.unwrap());
    _next = Option<OWN_ELEMENT_TYPE>();
    return out;
  }